

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

void __thiscall
Catch::StreamingReporterBase<Catch::TestEventListenerBase>::~StreamingReporterBase
          (StreamingReporterBase<Catch::TestEventListenerBase> *this)

{
  IStreamingReporter *in_RDI;
  vector<Catch::SectionInfo,_std::allocator<Catch::SectionInfo>_> *unaff_retaddr;
  
  in_RDI->_vptr_IStreamingReporter = (_func_int **)&PTR__StreamingReporterBase_0035f148;
  clara::std::vector<Catch::SectionInfo,_std::allocator<Catch::SectionInfo>_>::~vector
            (unaff_retaddr);
  LazyStat<Catch::TestCaseInfo>::~LazyStat((LazyStat<Catch::TestCaseInfo> *)0x2aa82e);
  LazyStat<Catch::GroupInfo>::~LazyStat((LazyStat<Catch::GroupInfo> *)0x2aa83c);
  LazyStat<Catch::TestRunInfo>::~LazyStat((LazyStat<Catch::TestRunInfo> *)0x2aa84a);
  clara::std::shared_ptr<const_Catch::IConfig>::~shared_ptr
            ((shared_ptr<const_Catch::IConfig> *)0x2aa858);
  IStreamingReporter::~IStreamingReporter(in_RDI);
  return;
}

Assistant:

~StreamingReporterBase() override = default;